

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

iterator * __thiscall
phmap::container_internal::
parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
::begin(iterator *__return_storage_ptr__,
       parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
       *this)

{
  reference inner;
  reference pvVar1;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  *this_00;
  iterator *it;
  iterator local_20;
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  *local_10;
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  *this_local;
  
  local_10 = this;
  inner = std::
          array<phmap::container_internal::parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>::Inner,_16UL>
          ::operator[](&this->sets_,0);
  pvVar1 = std::
           array<phmap::container_internal::parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>::Inner,_16UL>
           ::operator[](&this->sets_,0);
  this_00 = &std::
             array<phmap::container_internal::parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>::Inner,_16UL>
             ::operator[](&this->sets_,0)->set_;
  local_20 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             ::begin(this_00);
  iterator::iterator(__return_storage_ptr__,inner,pvVar1 + 0x10,&local_20);
  iterator::skip_empty(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() {
        auto it = iterator(&sets_[0], &sets_[0] + num_tables, sets_[0].set_.begin());
        it.skip_empty();
        return it;
    }